

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_TextureCoordinates * __thiscall
ON_Mesh::GetCachedTextureCoordinates
          (ON_Mesh *this,ONX_Model *onx_model,ON_Texture *texture,ON_MappingRef *mapping_ref)

{
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func;
  bool bVar1;
  ON_TextureCoordinates *pOVar2;
  ON_UUID *mapping_id;
  ON_Xform ocsTransform;
  undefined8 uVar3;
  code *pcVar4;
  code *pcVar5;
  undefined1 local_c8 [32];
  ON_UUID local_a8;
  ON_Xform local_98;
  
  uVar3 = 0;
  pcVar5 = std::
           _Function_handler<ON_TextureMapping_(const_ON_MappingChannel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp:4670:27)>
           ::_M_invoke;
  pcVar4 = std::
           _Function_handler<ON_TextureMapping_(const_ON_MappingChannel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp:4670:27)>
           ::_M_manager;
  bVar1 = ON_Texture::IsWcsProjected(texture);
  if ((bVar1) || (bVar1 = ON_Texture::IsWcsBoxProjected(texture), bVar1)) {
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_c8,
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&stack0xffffffffffffff18);
    get_mapping_func.super__Function_base._M_functor._8_8_ = uVar3;
    get_mapping_func.super__Function_base._M_functor._M_unused._M_object = onx_model;
    get_mapping_func.super__Function_base._M_manager = pcVar4;
    get_mapping_func._M_invoker = pcVar5;
    GetOcsTransform(&local_98,get_mapping_func,(ON_MappingRef *)local_c8);
    std::_Function_base::~_Function_base((_Function_base *)local_c8);
    bVar1 = ON_Texture::IsWcsBoxProjected(texture);
    local_a8 = WcsMappingId(&local_98,bVar1);
    pOVar2 = CachedTextureCoordinates(this,&local_a8);
  }
  else {
    if (mapping_ref == (ON_MappingRef *)0x0) {
      mapping_id = &ON_TextureMapping::SurfaceParameterTextureMappingId;
    }
    else {
      mapping_id = &ON_MappingRef::MappingChannel(mapping_ref,texture->m_mapping_channel_id)->
                    m_mapping_id;
      if ((ON_MappingChannel *)mapping_id == (ON_MappingChannel *)0x0) {
        pOVar2 = (ON_TextureCoordinates *)0x0;
        goto LAB_005189ca;
      }
    }
    pOVar2 = CachedTextureCoordinates(this,mapping_id);
  }
LAB_005189ca:
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff18);
  return pOVar2;
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::GetCachedTextureCoordinates(const ONX_Model& onx_model, const ON_Texture& texture, const ON_MappingRef* mapping_ref) const
{
  auto get_mapping_func = [&onx_model](const ON_MappingChannel* pMC)
    {
      return ONX_Model_GetTextureMappingHelper(onx_model, pMC);
    };

  return ::Internal_GetCachedTextureCoordinates(*this, get_mapping_func, texture, mapping_ref);
}